

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

int xercesc_4_0::XMLString::compareString(XMLCh *str1,XMLCh *str2)

{
  XMLSize_t XVar1;
  XMLCh *local_30;
  XMLCh *psz2;
  XMLCh *psz1;
  XMLCh *str2_local;
  XMLCh *str1_local;
  
  local_30 = str2;
  psz2 = str1;
  if ((str1 == (XMLCh *)0x0) || (str2 == (XMLCh *)0x0)) {
    if (str1 == (XMLCh *)0x0) {
      XVar1 = stringLen(str2);
      return -(int)XVar1;
    }
    if (str2 == (XMLCh *)0x0) {
      XVar1 = stringLen(str1);
      return (int)XVar1;
    }
  }
  while( true ) {
    if (*psz2 != *local_30) {
      return (uint)(ushort)*psz2 - (uint)(ushort)*local_30;
    }
    if (*psz2 == L'\0') break;
    psz2 = psz2 + 1;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

int XMLString::compareString(   const   XMLCh* const    str1
                                , const XMLCh* const    str2)
{
    const XMLCh* psz1 = str1;
    const XMLCh* psz2 = str2;

    if (psz1 == 0 || psz2 == 0) {

        if (psz1 == 0) {
            return 0 - (int)XMLString::stringLen(psz2);
        }
		else if (psz2 == 0) {
            return (int)XMLString::stringLen(psz1);
        }
    }

    for (;;)
    {
        // If an inequality, then return the difference
        if (*psz1 != *psz2)
            return int(*psz1) - int(*psz2);

        // If either has ended, then they both ended, so equal
        if (!*psz1)
            break;

        // Move upwards for the next round
        psz1++;
        psz2++;
    }
    return 0;
}